

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingScanPartial<signed_char,signed_char,unsigned_char>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t dst;
  BitpackingMode BVar1;
  byte width;
  data_ptr_t pdVar2;
  BitpackingScanState<signed_char,_signed_char> *this;
  idx_t iVar3;
  ulong uVar4;
  uint uVar5;
  ulong __n;
  idx_t remaining;
  ulong uVar6;
  
  this = (BitpackingScanState<signed_char,_signed_char> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar2 = result->data;
  uVar4 = 0;
  Vector::SetVectorType(result,FLAT_VECTOR);
  do {
    uVar6 = scan_count - uVar4;
    if (scan_count < uVar4 || uVar6 == 0) {
      return;
    }
    iVar3 = this->current_group_offset;
    if (iVar3 == 0x800) {
      BitpackingScanState<signed_char,_signed_char>::LoadNextGroup(this);
      iVar3 = this->current_group_offset;
    }
    BVar1 = (this->current_group).mode;
    if (BVar1 == CONSTANT_DELTA) {
      __n = 0x800 - iVar3;
      if (uVar6 < 0x800 - iVar3) {
        __n = uVar6;
      }
      for (uVar6 = 0; iVar3 = this->current_group_offset, __n != uVar6; uVar6 = uVar6 + 1) {
        pdVar2[uVar6 + uVar4 + result_offset] =
             this->current_constant * ((char)iVar3 + (char)uVar6) + this->current_frame_of_reference
        ;
      }
LAB_01a3cc33:
      iVar3 = iVar3 + __n;
    }
    else {
      if (BVar1 == CONSTANT) {
        __n = 0x800 - iVar3;
        if (uVar6 < 0x800 - iVar3) {
          __n = uVar6;
        }
        switchD_016d4fed::default
                  (pdVar2 + uVar4 + result_offset,(uint)(byte)this->current_constant,uVar6);
        iVar3 = this->current_group_offset;
        goto LAB_01a3cc33;
      }
      uVar5 = (uint)iVar3 & 0x1f;
      __n = 0x20 - (ulong)uVar5;
      if (uVar6 < __n) {
        __n = uVar6;
      }
      width = this->current_width;
      dst = pdVar2 + uVar4 + result_offset;
      if (__n == 0x20) {
        BitpackingPrimitives::UnPackGroup<signed_char>
                  (dst,this->current_group_ptr +
                       ((width * iVar3 >> 3) - (ulong)(width * uVar5 >> 3)),width,true);
      }
      else {
        BitpackingPrimitives::UnPackGroup<signed_char>
                  ((data_ptr_t)this->decompression_buffer,
                   this->current_group_ptr + ((width * iVar3 >> 3) - (ulong)(width * uVar5 >> 3)),
                   width,true);
        switchD_016b0717::default(dst,this->decompression_buffer + uVar5,__n);
      }
      BVar1 = (this->current_group).mode;
      ApplyFrameOfReference<signed_char>((char *)dst,this->current_frame_of_reference,__n);
      if (BVar1 == DELTA_FOR) {
        DeltaDecode<signed_char>((char *)dst,this->current_delta_offset,__n);
        this->current_delta_offset = dst[__n - 1];
      }
      iVar3 = this->current_group_offset + __n;
    }
    this->current_group_offset = iVar3;
    uVar4 = uVar4 + __n;
  } while( true );
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}